

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O2

void opj_t1_enc_refpass_step
               (opj_t1_t *t1,opj_flag_t *flagsp,OPJ_INT32 *datap,OPJ_INT32 bpno,OPJ_INT32 one,
               OPJ_INT32 *nmsedec,OPJ_BYTE type,OPJ_UINT32 ci)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  byte bVar4;
  OPJ_INT16 *pOVar5;
  uint uVar6;
  
  bVar4 = (char)ci * '\x03';
  uVar6 = *flagsp >> (bVar4 & 0x1f);
  if ((uVar6 & 0x200010) == 0x10) {
    uVar1 = *datap;
    uVar2 = -uVar1;
    if (0 < (int)uVar1) {
      uVar2 = uVar1;
    }
    pOVar5 = lut_nmsedec_ref;
    if (bpno == 0) {
      pOVar5 = lut_nmsedec_ref0;
    }
    *nmsedec = *nmsedec + (int)pOVar5[uVar2 >> ((byte)bpno & 0x1f) & 0x7f];
    uVar1 = *datap;
    uVar2 = -uVar1;
    if (0 < (int)uVar1) {
      uVar2 = uVar1;
    }
    uVar3 = 0x10;
    if ((uVar6 >> 0x14 & 1) == 0) {
      uVar3 = (ulong)(0xf - ((uVar6 & 0x1ef) == 0));
    }
    (t1->mqc).curctx = (t1->mqc).ctxs + uVar3;
    uVar6 = (uint)((uVar2 & one) != 0);
    if (type == '\x01') {
      opj_mqc_bypass_enc(&t1->mqc,uVar6);
    }
    else {
      opj_mqc_encode(&t1->mqc,uVar6);
    }
    *flagsp = *flagsp | 0x100000 << (bVar4 & 0x1f);
  }
  return;
}

Assistant:

static INLINE void opj_t1_enc_refpass_step(opj_t1_t *t1,
        opj_flag_t *flagsp,
        OPJ_INT32 *datap,
        OPJ_INT32 bpno,
        OPJ_INT32 one,
        OPJ_INT32 *nmsedec,
        OPJ_BYTE type,
        OPJ_UINT32 ci)
{
    OPJ_UINT32 v;

    opj_mqc_t *mqc = &(t1->mqc);   /* MQC component */

    OPJ_UINT32 const shift_flags =
        (*flagsp >> (ci * 3U));

    if ((shift_flags & (T1_SIGMA_THIS | T1_PI_THIS)) == T1_SIGMA_THIS) {
        OPJ_UINT32 ctxt = opj_t1_getctxno_mag(shift_flags);
        *nmsedec += opj_t1_getnmsedec_ref((OPJ_UINT32)opj_int_abs(*datap),
                                          (OPJ_UINT32)bpno);
        v = (opj_int_abs(*datap) & one) ? 1 : 0;
#ifdef DEBUG_ENC_REF
        fprintf(stderr, "  ctxt=%d\n", ctxt);
#endif
        opj_mqc_setcurctx(mqc, ctxt);
        if (type == T1_TYPE_RAW) {  /* BYPASS/LAZY MODE */
            opj_mqc_bypass_enc(mqc, v);
        } else {
            opj_mqc_encode(mqc, v);
        }
        *flagsp |= T1_MU_THIS << (ci * 3U);
    }
}